

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O3

int __thiscall deqp::gls::TextureSamplerTest::init(TextureSamplerTest *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  GLenum GVar2;
  RenderContext *renderCtx;
  bool bVar3;
  ContextType CVar4;
  int extraout_EAX;
  mapped_type *pmVar5;
  ShaderProgram *this_00;
  TestError *this_01;
  char *__s;
  long lVar6;
  char *__s_00;
  ProgramSources sources;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  undefined1 local_1e8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_158;
  undefined1 local_138 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  StringTemplate local_68;
  StringTemplate local_48;
  
  GVar2 = this->m_target;
  if (GVar2 == 0xde1) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} sampler2D u_sampler;\n${FRAG_IN} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, v_texCoord);\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec2 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position, 0.0, 1.0);\n}"
    ;
  }
  else if (GVar2 == 0x8513) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} samplerCube u_sampler;\n${FRAG_IN} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, vec3(cos(3.14 * v_texCoord.y) * sin(3.14 * v_texCoord.x), sin(3.14 * v_texCoord.y), cos(3.14 * v_texCoord.y) * cos(3.14 * v_texCoord.x)));\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec4 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position.zw;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
    ;
  }
  else if (GVar2 == 0x806f) {
    __s = 
    "${FRAG_HDR}uniform ${LOWP} sampler3D u_sampler;\n${FRAG_IN} ${MEDIUMP} vec3 v_texCoord;\nvoid main (void)\n{\n\t${FRAG_COLOR} = texture(u_sampler, v_texCoord);\n}"
    ;
    __s_00 = 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec3 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec3 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
    ;
  }
  else {
    __s_00 = (char *)0x0;
    __s = (char *)0x0;
  }
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  CVar4.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::isGLSLVersionSupported(CVar4,GLSL_VERSION_300_ES);
  if (bVar3) {
    pcVar1 = local_1e8 + 0x10;
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_HDR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1b957be);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_HDR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1bf61c4);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_IN","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c3b6d3);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_OUT","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c1a48e);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_IN","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c3b6d3);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_COLOR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c82b68);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"HIGHP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1bbd4df);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"LOWP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c13c0f);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"MEDIUMP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1bbd4ed);
  }
  else {
    CVar4.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    bVar3 = glu::isGLSLVersionSupported(CVar4,GLSL_VERSION_330);
    if (!bVar3) goto LAB_0186f7d0;
    pcVar1 = local_1e8 + 0x10;
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_HDR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1caf399);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_HDR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1cb16b0);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_IN","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c3b6d3);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"VTX_OUT","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c1a48e);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_IN","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c3b6d3);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"FRAG_COLOR","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c82b68);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"HIGHP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1bbd4df);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"LOWP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1c13c0f);
    if ((pointer)local_1e8._0_8_ != pcVar1) {
      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
    }
    local_1e8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"MEDIUMP","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,(key_type *)local_1e8);
    std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1bbd4ed);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
LAB_0186f7d0:
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s_00,&local_1e9);
  tcu::StringTemplate::StringTemplate(&local_48,&local_a8);
  tcu::StringTemplate::specialize
            (&local_88,&local_48,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,__s,&local_1ea);
  tcu::StringTemplate::StringTemplate(&local_68,&local_e8);
  tcu::StringTemplate::specialize
            (&local_c8,&local_68,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_118);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1e8,0,0xac);
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  local_138[0x10] = 0;
  local_138._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0,&local_c8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1e8);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_158);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk != false) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_118);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this->m_program);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to compile shaders",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
             ,0xf8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureSamplerTest::init (void)
{
	const char* vertexShaderTemplate	= selectVertexShader(m_target);
	const char* fragmentShaderTemplate	= selectFragmentShader(m_target);

	std::map<std::string, std::string>	params;

	if (glu::isGLSLVersionSupported(m_renderCtx.getType(), glu::GLSL_VERSION_300_ES))
	{
		params["VTX_HDR"]		= "#version 300 es\n";
		params["FRAG_HDR"]		= "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "o_color";
		params["HIGHP"]			= "highp";
		params["LOWP"]			= "lowp";
		params["MEDIUMP"]		= "mediump";
	}
	else if (glu::isGLSLVersionSupported(m_renderCtx.getType(), glu::GLSL_VERSION_330))
	{
		params["VTX_HDR"]		= "#version 330\n";
		params["FRAG_HDR"]		= "#version 330\nlayout(location = 0) out mediump vec4 o_color;\n";
		params["VTX_IN"]		= "in";
		params["VTX_OUT"]		= "out";
		params["FRAG_IN"]		= "in";
		params["FRAG_COLOR"]	= "o_color";
		params["HIGHP"]			= "highp";
		params["LOWP"]			= "lowp";
		params["MEDIUMP"]		= "mediump";
	}
	else
		DE_ASSERT(false);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_renderCtx,
									   glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderTemplate).specialize(params),
															   tcu::StringTemplate(fragmentShaderTemplate).specialize(params)));

	if (!m_program->isOk())
	{
		tcu::TestLog& log = m_testCtx.getLog();
		log << *m_program;
		TCU_FAIL("Failed to compile shaders");
	}
}